

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Match(IMkvReader *pReader,longlong *pos,unsigned_long expected_id,uchar **buf,
                     size_t *buflen)

{
  int iVar1;
  uchar **ppuVar2;
  unsigned_long_long element_size;
  uchar *puVar3;
  long buflen_;
  unsigned_long_long rollover_check;
  longlong size;
  longlong id;
  long len;
  long status;
  longlong available;
  longlong total;
  size_t *buflen_local;
  uchar **buf_local;
  unsigned_long expected_id_local;
  longlong *pos_local;
  IMkvReader *pReader_local;
  
  if ((pReader == (IMkvReader *)0x0) || (*pos < 0)) {
    pReader_local._7_1_ = false;
  }
  else {
    available = 0;
    status = 0;
    total = (longlong)buflen;
    buflen_local = (size_t *)buf;
    buf_local = (uchar **)expected_id;
    expected_id_local = (unsigned_long)pos;
    pos_local = (longlong *)pReader;
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&available,&status);
    len = (long)iVar1;
    if ((len < 0) || ((-1 < available && (available < status)))) {
      pReader_local._7_1_ = false;
    }
    else {
      id = 0;
      ppuVar2 = (uchar **)ReadID((IMkvReader *)pos_local,*(longlong *)expected_id_local,&id);
      if (((long)ppuVar2 < 0) || (id < status - *(long *)expected_id_local)) {
        pReader_local._7_1_ = false;
      }
      else if (ppuVar2 == buf_local) {
        *(longlong *)expected_id_local = id + *(long *)expected_id_local;
        element_size = ReadUInt((IMkvReader *)pos_local,*(longlong *)expected_id_local,&id);
        if (((((long)element_size < 0) || (id < 1)) || (8 < id)) ||
           (id < status - *(long *)expected_id_local)) {
          pReader_local._7_1_ = false;
        }
        else if ((ulong)(*(long *)expected_id_local + id) < 0x8000000000000000) {
          *(longlong *)expected_id_local = id + *(long *)expected_id_local;
          if (*(long *)expected_id_local + element_size < 0x8000000000000000) {
            if (status < (long)(*(long *)expected_id_local + element_size)) {
              pReader_local._7_1_ = false;
            }
            else if ((long)element_size < 0x7fffffffffffffff) {
              puVar3 = SafeArrayAlloc<unsigned_char>(1,element_size);
              *buflen_local = (size_t)puVar3;
              if (*buflen_local == 0) {
                pReader_local._7_1_ = false;
              }
              else {
                iVar1 = (**(code **)*pos_local)
                                  (pos_local,*(undefined8 *)expected_id_local,element_size,
                                   *buflen_local);
                if (iVar1 == 0) {
                  *(unsigned_long_long *)total = element_size;
                  *(unsigned_long_long *)expected_id_local =
                       element_size + *(long *)expected_id_local;
                  pReader_local._7_1_ = true;
                }
                else {
                  pReader_local._7_1_ = false;
                }
              }
            }
            else {
              pReader_local._7_1_ = false;
            }
          }
          else {
            pReader_local._7_1_ = false;
          }
        }
        else {
          pReader_local._7_1_ = false;
        }
      }
      else {
        pReader_local._7_1_ = false;
      }
    }
  }
  return pReader_local._7_1_;
}

Assistant:

bool Match(IMkvReader* pReader, long long& pos, unsigned long expected_id,
           unsigned char*& buf, size_t& buflen) {
  if (!pReader || pos < 0)
    return false;

  long long total = 0;
  long long available = 0;

  long status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return false;

  long len = 0;
  const long long id = ReadID(pReader, pos, len);
  if (id < 0 || (available - pos) > len)
    return false;

  if (static_cast<unsigned long>(id) != expected_id)
    return false;

  pos += len;  // consume id

  const long long size = ReadUInt(pReader, pos, len);
  if (size < 0 || len <= 0 || len > 8 || (available - pos) > len)
    return false;

  unsigned long long rollover_check =
      static_cast<unsigned long long>(pos) + len;
  if (rollover_check > LLONG_MAX)
    return false;

  pos += len;  // consume length of size of payload

  rollover_check = static_cast<unsigned long long>(pos) + size;
  if (rollover_check > LLONG_MAX)
    return false;

  if ((pos + size) > available)
    return false;

  if (size >= LONG_MAX)
    return false;

  const long buflen_ = static_cast<long>(size);

  buf = SafeArrayAlloc<unsigned char>(1, buflen_);
  if (!buf)
    return false;

  status = pReader->Read(pos, buflen_, buf);
  if (status != 0)
    return false;

  buflen = buflen_;

  pos += size;  // consume size of payload
  return true;
}